

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parasail_aligner.cpp
# Opt level: O0

void process(unsigned_long *count_generated,PairSet *pairs,quad *q,int *SA,uchar *BWT,int *SID,
            vector<int,_std::allocator<int>_> *DB,char *sentinal,int *cutoff)

{
  int iVar1;
  const_reference pvVar2;
  int local_58;
  int local_54;
  int j_1;
  int i_1;
  int j;
  int i;
  size_t child_index;
  size_t n_children;
  int *SID_local;
  uchar *BWT_local;
  int *SA_local;
  quad *q_local;
  PairSet *pairs_local;
  unsigned_long *count_generated_local;
  
  n_children = (size_t)SID;
  SID_local = (int *)BWT;
  BWT_local = (uchar *)SA;
  SA_local = &q->lcp;
  q_local = (quad *)pairs;
  pairs_local = (PairSet *)count_generated;
  child_index = std::vector<quad,_std::allocator<quad>_>::size(&q->children);
  _j = 0;
  if (*cutoff <= *SA_local) {
    if (child_index == 0) {
      child_index = 0;
      for (local_54 = SA_local[1]; local_58 = local_54, local_54 <= SA_local[2];
          local_54 = local_54 + 1) {
        while (local_58 = local_58 + 1, local_58 <= SA_local[2]) {
          pair_check((unsigned_long *)pairs_local,(PairSet *)q_local,&local_54,&local_58,
                     (int *)BWT_local,(uchar *)SID_local,(int *)n_children,DB,sentinal);
        }
      }
    }
    else {
      for (i_1 = SA_local[1]; iVar1 = i_1, i_1 <= SA_local[2]; i_1 = i_1 + 1) {
        j_1 = i_1 + 1;
        if ((_j < child_index) &&
           (pvVar2 = std::vector<quad,_std::allocator<quad>_>::operator[]
                               ((vector<quad,_std::allocator<quad>_> *)(SA_local + 4),_j),
           pvVar2->lb <= iVar1)) {
          pvVar2 = std::vector<quad,_std::allocator<quad>_>::operator[]
                             ((vector<quad,_std::allocator<quad>_> *)(SA_local + 4),_j);
          iVar1 = i_1;
          j_1 = pvVar2->rb + 1;
          pvVar2 = std::vector<quad,_std::allocator<quad>_>::operator[]
                             ((vector<quad,_std::allocator<quad>_> *)(SA_local + 4),_j);
          if (pvVar2->rb <= iVar1) {
            _j = _j + 1;
          }
        }
        for (; j_1 <= SA_local[2]; j_1 = j_1 + 1) {
          pair_check((unsigned_long *)pairs_local,(PairSet *)q_local,&i_1,&j_1,(int *)BWT_local,
                     (uchar *)SID_local,(int *)n_children,DB,sentinal);
        }
      }
    }
  }
  return;
}

Assistant:

inline static void process(
        unsigned long &count_generated,
        PairSet &pairs,
        const quad &q,
        const int * const restrict SA,
        const unsigned char * const restrict BWT,
        const int * const restrict SID,
        const vector<int> &DB,
        const char &sentinal,
        const int &cutoff)
{
    const size_t n_children = q.children.size();
    size_t child_index = 0;

    if (q.lcp < cutoff) return;

    if (n_children) {
        for (int i=q.lb; i<=q.rb; ++i) {
            int j = i+1;
            if (child_index < n_children) {
                if (i >= q.children[child_index].lb) {
                    j = q.children[child_index].rb+1;
                    if (i >= q.children[child_index].rb) {
                        ++child_index;
                    }
                }
            }
            for (/*nope*/; j<=q.rb; ++j) {
                pair_check(count_generated, pairs, i, j, SA, BWT, SID, DB, sentinal);
            }
        }
    }
    else {
        for (int i=q.lb; i<=q.rb; ++i) {
            for (int j=i+1; j<=q.rb; ++j) {
                pair_check(count_generated, pairs, i, j, SA, BWT, SID, DB, sentinal);
            }
        }
    }
}